

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

Layout * __thiscall ear::Layout::withoutLfe(Layout *__return_storage_ptr__,Layout *this)

{
  pointer pCVar1;
  pointer __x;
  allocator<char> local_119;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_118;
  string local_100 [32];
  string local_e0;
  variant<ear::PolarScreen,_ear::CartesianScreen> local_c0;
  optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_90;
  optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_58;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_119);
  local_118.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultScreen();
  boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
  optional_base(&local_58,&local_c0);
  Layout(__return_storage_ptr__,&local_e0,&local_118,
         (optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> *)&local_58);
  boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
  ~optional_base(&local_58);
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content(&local_c0);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_118);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string(local_100,(string *)this);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::~string(local_100);
  boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
  optional_base(&local_90,&(this->_screen).super_type);
  boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
  assign(&(__return_storage_ptr__->_screen).super_type,&local_90);
  boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
  ~optional_base(&local_90);
  pCVar1 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (__x = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>.
             _M_impl.super__Vector_impl_data._M_start; __x != pCVar1; __x = __x + 1) {
    if (__x->_isLfe == false) {
      std::vector<ear::Channel,_std::allocator<ear::Channel>_>::push_back
                (&__return_storage_ptr__->_channels,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Layout Layout::withoutLfe() const {
    Layout layoutWithoutLfe;
    layoutWithoutLfe.name(_name);
    layoutWithoutLfe.screen(_screen);
    std::copy_if(_channels.begin(), _channels.end(),
                 back_inserter(layoutWithoutLfe.channels()),
                 [](const Channel& c) { return !c.isLfe(); });
    return layoutWithoutLfe;
  }